

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O2

UChar32 anon_unknown.dwarf_2e10e3::getRange
                  (void *trie,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue
                  )

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  int iVar5;
  uint32_t *puVar6;
  UChar32 UVar7;
  ulong uVar8;
  bool bVar9;
  
  if ((uint)start < 0x110000) {
    if (start < *(int *)((long)trie + 0x30)) {
      uVar2 = *(uint32_t *)((long)trie + 0x28);
      if (filter != (UCPMapValueFilter *)0x0) {
        uVar2 = (*filter)(context,uVar2);
      }
      uVar8 = (ulong)((uint)start >> 4);
      bVar9 = false;
      puVar6 = pValue;
      do {
        uVar1 = *(uint32_t *)(*trie + uVar8 * 4);
        if (*(char *)((long)trie + uVar8 + 0x40) == '\0') {
          uVar3 = uVar1;
          if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
            uVar3 = uVar2;
          }
          if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28))) {
            uVar3 = (*filter)(context,uVar1);
          }
          if (bVar9) {
            if (uVar3 != (uint)puVar6) goto LAB_002c6d25;
          }
          else {
            bVar9 = true;
            if (pValue != (uint32_t *)0x0) {
              *pValue = uVar3;
            }
            puVar6 = (uint32_t *)(ulong)uVar3;
          }
          start = (start & 0xfffffff0U) + 0x10;
        }
        else {
          lVar4 = (long)(int)(uVar1 + (start & 0xfU));
          uVar1 = *(uint32_t *)(*(long *)((long)trie + 0x10) + lVar4 * 4);
          uVar3 = uVar1;
          if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
            uVar3 = uVar2;
          }
          if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28))) {
            uVar3 = (*filter)(context,uVar1);
          }
          if (bVar9) {
            if (uVar3 != (uint)puVar6) {
LAB_002c6d25:
              return start - 1;
            }
          }
          else {
            bVar9 = true;
            if (pValue != (uint32_t *)0x0) {
              *pValue = uVar3;
            }
            puVar6 = (uint32_t *)(ulong)uVar3;
          }
          iVar5 = start - 1;
          while( true ) {
            lVar4 = lVar4 + 1;
            start = iVar5 + 2;
            if ((start & 0xfU) == 0) break;
            uVar1 = *(uint32_t *)(*(long *)((long)trie + 0x10) + lVar4 * 4);
            uVar3 = uVar1;
            if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
              uVar3 = uVar2;
            }
            if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28)))
            {
              uVar3 = (*filter)(context,uVar1);
            }
            iVar5 = iVar5 + 1;
            if (uVar3 != (uint32_t)puVar6) {
              return iVar5;
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (start < *(int *)((long)trie + 0x30));
      uVar1 = *(uint32_t *)((long)trie + 0x34);
      bVar9 = uVar1 != *(uint32_t *)((long)trie + 0x28);
      if (bVar9) {
        uVar2 = uVar1;
      }
      if (bVar9 && filter != (UCPMapValueFilter *)0x0) {
        uVar2 = (*filter)(context,uVar1);
      }
      UVar7 = 0x10ffff;
      if (uVar2 != (uint32_t)puVar6) {
        UVar7 = start - 1;
      }
    }
    else {
      UVar7 = 0x10ffff;
      if (pValue != (uint32_t *)0x0) {
        uVar2 = *(uint32_t *)((long)trie + 0x34);
        if (filter != (UCPMapValueFilter *)0x0) {
          uVar2 = (*filter)(context,uVar2);
        }
        *pValue = uVar2;
      }
    }
  }
  else {
    UVar7 = -1;
  }
  return UVar7;
}

Assistant:

UChar32 getRange(const void *t, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    if ((uint32_t)start > MAX_UNICODE) {
        return U_SENTINEL;
    }
    const UCPTrie *trie = reinterpret_cast<const UCPTrie *>(t);
    UCPTrieValueWidth valueWidth = (UCPTrieValueWidth)trie->valueWidth;
    if (start >= trie->highStart) {
        if (pValue != nullptr) {
            int32_t di = trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET;
            uint32_t value = getValue(trie->data, valueWidth, di);
            if (filter != nullptr) { value = filter(context, value); }
            *pValue = value;
        }
        return MAX_UNICODE;
    }

    uint32_t nullValue = trie->nullValue;
    if (filter != nullptr) { nullValue = filter(context, nullValue); }
    const uint16_t *index = trie->index;

    int32_t prevI3Block = -1;
    int32_t prevBlock = -1;
    UChar32 c = start;
    uint32_t value;
    bool haveValue = false;
    do {
        int32_t i3Block;
        int32_t i3;
        int32_t i3BlockLength;
        int32_t dataBlockLength;
        if (c <= 0xffff && (trie->type == UCPTRIE_TYPE_FAST || c <= UCPTRIE_SMALL_MAX)) {
            i3Block = 0;
            i3 = c >> UCPTRIE_FAST_SHIFT;
            i3BlockLength = trie->type == UCPTRIE_TYPE_FAST ?
                UCPTRIE_BMP_INDEX_LENGTH : UCPTRIE_SMALL_INDEX_LENGTH;
            dataBlockLength = UCPTRIE_FAST_DATA_BLOCK_LENGTH;
        } else {
            // Use the multi-stage index.
            int32_t i1 = c >> UCPTRIE_SHIFT_1;
            if (trie->type == UCPTRIE_TYPE_FAST) {
                U_ASSERT(0xffff < c && c < trie->highStart);
                i1 += UCPTRIE_BMP_INDEX_LENGTH - UCPTRIE_OMITTED_BMP_INDEX_1_LENGTH;
            } else {
                U_ASSERT(c < trie->highStart && trie->highStart > UCPTRIE_SMALL_LIMIT);
                i1 += UCPTRIE_SMALL_INDEX_LENGTH;
            }
            i3Block = trie->index[
                (int32_t)trie->index[i1] + ((c >> UCPTRIE_SHIFT_2) & UCPTRIE_INDEX_2_MASK)];
            if (i3Block == prevI3Block && (c - start) >= UCPTRIE_CP_PER_INDEX_2_ENTRY) {
                // The index-3 block is the same as the previous one, and filled with value.
                U_ASSERT((c & (UCPTRIE_CP_PER_INDEX_2_ENTRY - 1)) == 0);
                c += UCPTRIE_CP_PER_INDEX_2_ENTRY;
                continue;
            }
            prevI3Block = i3Block;
            if (i3Block == trie->index3NullOffset) {
                // This is the index-3 null block.
                if (haveValue) {
                    if (nullValue != value) {
                        return c - 1;
                    }
                } else {
                    value = nullValue;
                    if (pValue != nullptr) { *pValue = nullValue; }
                    haveValue = true;
                }
                prevBlock = trie->dataNullOffset;
                c = (c + UCPTRIE_CP_PER_INDEX_2_ENTRY) & ~(UCPTRIE_CP_PER_INDEX_2_ENTRY - 1);
                continue;
            }
            i3 = (c >> UCPTRIE_SHIFT_3) & UCPTRIE_INDEX_3_MASK;
            i3BlockLength = UCPTRIE_INDEX_3_BLOCK_LENGTH;
            dataBlockLength = UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
        }
        // Enumerate data blocks for one index-3 block.
        do {
            int32_t block;
            if ((i3Block & 0x8000) == 0) {
                block = index[i3Block + i3];
            } else {
                // 18-bit indexes stored in groups of 9 entries per 8 indexes.
                int32_t group = (i3Block & 0x7fff) + (i3 & ~7) + (i3 >> 3);
                int32_t gi = i3 & 7;
                block = ((int32_t)index[group++] << (2 + (2 * gi))) & 0x30000;
                block |= index[group + gi];
            }
            if (block == prevBlock && (c - start) >= dataBlockLength) {
                // The block is the same as the previous one, and filled with value.
                U_ASSERT((c & (dataBlockLength - 1)) == 0);
                c += dataBlockLength;
            } else {
                int32_t dataMask = dataBlockLength - 1;
                prevBlock = block;
                if (block == trie->dataNullOffset) {
                    // This is the data null block.
                    if (haveValue) {
                        if (nullValue != value) {
                            return c - 1;
                        }
                    } else {
                        value = nullValue;
                        if (pValue != nullptr) { *pValue = nullValue; }
                        haveValue = true;
                    }
                    c = (c + dataBlockLength) & ~dataMask;
                } else {
                    int32_t di = block + (c & dataMask);
                    uint32_t value2 = getValue(trie->data, valueWidth, di);
                    value2 = maybeFilterValue(value2, trie->nullValue, nullValue,
                                              filter, context);
                    if (haveValue) {
                        if (value2 != value) {
                            return c - 1;
                        }
                    } else {
                        value = value2;
                        if (pValue != nullptr) { *pValue = value; }
                        haveValue = true;
                    }
                    while ((++c & dataMask) != 0) {
                        if (maybeFilterValue(getValue(trie->data, valueWidth, ++di),
                                             trie->nullValue, nullValue,
                                             filter, context) != value) {
                            return c - 1;
                        }
                    }
                }
            }
        } while (++i3 < i3BlockLength);
    } while (c < trie->highStart);
    U_ASSERT(haveValue);
    int32_t di = trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET;
    uint32_t highValue = getValue(trie->data, valueWidth, di);
    if (maybeFilterValue(highValue, trie->nullValue, nullValue,
                         filter, context) != value) {
        return c - 1;
    } else {
        return MAX_UNICODE;
    }
}